

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O1

int Bmc_CexVerify(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  ulong uVar6;
  byte bVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xbfffffffbfffffff | 0x40000000;
  iVar12 = p->nRegs;
  if (0 < iVar12) {
    iVar8 = 0;
    do {
      iVar10 = p->vCos->nSize;
      uVar14 = (iVar10 - iVar12) + iVar8;
      if (((int)uVar14 < 0) || (iVar10 <= (int)uVar14)) goto LAB_0052357d;
      iVar12 = p->vCos->pArray[uVar14];
      lVar13 = (long)iVar12;
      if ((lVar13 < 0) || (p->nObjs <= iVar12)) goto LAB_0052355e;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      *(ulong *)(pGVar4 + lVar13) = *(ulong *)(pGVar4 + lVar13) & 0xbfffffffbfffffff | 0x40000000;
      iVar8 = iVar8 + 1;
      iVar12 = p->nRegs;
    } while (iVar8 < iVar12);
  }
  if (-1 < pCex->iFrame) {
    iVar12 = 0;
    do {
      pVVar9 = p->vCis;
      uVar15 = (ulong)(uint)pVVar9->nSize;
      if (p->nRegs < pVVar9->nSize) {
        lVar13 = 0;
        do {
          if ((int)uVar15 <= lVar13) goto LAB_0052357d;
          iVar8 = pVVar9->pArray[lVar13];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_0052355e;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar8;
          uVar14 = pCexCare->nPis * iVar12 + pCexCare->nRegs + (int)lVar13;
          if (((uint)(&pCexCare[1].iPo)[(int)uVar14 >> 5] >> (uVar14 & 0x1f) & 1) == 0) {
            uVar15 = *(ulong *)pGVar4 | 0x4000000040000000;
          }
          else {
            uVar14 = pCex->nPis * iVar12 + pCex->nRegs + (int)lVar13;
            if (((uint)(&pCex[1].iPo)[(int)uVar14 >> 5] >> (uVar14 & 0x1f) & 1) == 0) {
              uVar15 = *(ulong *)pGVar4 & 0xbfffffffbfffffff | 0x40000000;
            }
            else {
              uVar15 = *(ulong *)pGVar4 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
          }
          *(ulong *)pGVar4 = uVar15;
          lVar13 = lVar13 + 1;
          pVVar9 = p->vCis;
          uVar15 = (ulong)pVVar9->nSize;
        } while (lVar13 < (long)(uVar15 - (long)p->nRegs));
      }
      iVar8 = p->nRegs;
      if (0 < iVar8) {
        iVar10 = 0;
        do {
          iVar2 = p->vCis->nSize;
          uVar14 = iVar10 + (iVar2 - iVar8);
          if (((int)uVar14 < 0) || (iVar2 <= (int)uVar14)) goto LAB_0052357d;
          iVar3 = p->vCis->pArray[uVar14];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_0052355e;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          pGVar1 = pGVar4 + iVar3;
          uVar15 = *(ulong *)pGVar1;
          if (((~(uint)uVar15 & 0x9fffffff) != 0) ||
             (uVar14 = (uint)(uVar15 >> 0x20) & 0x1fffffff, (int)uVar14 < iVar2 - iVar8)) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar8 = p->vCos->nSize;
          uVar14 = (iVar8 - iVar2) + uVar14;
          if (((int)uVar14 < 0) || (iVar8 <= (int)uVar14)) goto LAB_0052357d;
          iVar8 = p->vCos->pArray[uVar14];
          lVar13 = (long)iVar8;
          if ((lVar13 < 0) || (p->nObjs <= iVar8)) goto LAB_0052355e;
          if ((*(ulong *)(pGVar4 + lVar13) & 0x4000000040000000) == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x356,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar6 = *(ulong *)(pGVar4 + lVar13) & 0x40000000;
          *(ulong *)pGVar1 = uVar15 & 0xffffffffbfffffff | uVar6;
          *(ulong *)pGVar1 =
               uVar15 & 0xbfffffffbfffffff | uVar6 |
               *(ulong *)(pGVar4 + lVar13) & 0x4000000000000000;
          iVar10 = iVar10 + 1;
          iVar8 = p->nRegs;
        } while (iVar10 < iVar8);
      }
      if (0 < p->nObjs) {
        lVar13 = 0;
        lVar16 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar15 = *(ulong *)(&pGVar4->field_0x0 + lVar13);
          uVar14 = (uint)uVar15;
          if ((uVar15 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar14) {
            uVar6 = *(ulong *)((long)pGVar4 +
                              lVar13 + (ulong)(uint)((int)(uVar15 & 0x1fffffff) << 2) * -3) &
                    0x4000000040000000;
            if (uVar6 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            uVar11 = *(ulong *)((long)pGVar4 +
                               lVar13 + (ulong)((uint)(uVar15 >> 0x1e) & 0x7ffffffc) * -3) &
                     0x4000000040000000;
            if (uVar11 == 0) {
              __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x33f,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
            }
            if ((((((uVar14 >> 0x1d & 1) == 0) || (uVar6 != 0x4000000000000000)) &&
                 (((uVar14 >> 0x1d & 1) != 0 || (uVar6 != 0x40000000)))) &&
                (((uVar15 >> 0x3d & 1) == 0 || (uVar11 != 0x4000000000000000)))) &&
               (((uVar15 >> 0x3d & 1) != 0 || (uVar11 != 0x40000000)))) {
              if ((((byte)(uVar15 >> 0x1d) & 1 & uVar6 == 0x40000000) != 0) ||
                 ((uVar15 >> 0x1d & 1) == 0 && uVar6 == 0x4000000000000000)) {
                bVar7 = (byte)(uVar15 >> 0x3d) & 1;
                if (((bVar7 & uVar11 == 0x40000000) != 0) ||
                   (bVar7 == 0 && uVar11 == 0x4000000000000000)) {
                  uVar15 = uVar15 & 0xbfffffff3fffffff | 0x4000000000000000;
                  goto LAB_00523351;
                }
              }
              uVar15 = uVar15 | 0x4000000040000000;
            }
            else {
              uVar15 = uVar15 & 0xbfffffff3fffffff | 0x40000000;
            }
LAB_00523351:
            *(ulong *)(&pGVar4->field_0x0 + lVar13) = uVar15;
          }
          lVar16 = lVar16 + 1;
          lVar13 = lVar13 + 0xc;
        } while (lVar16 < p->nObjs);
      }
      pVVar9 = p->vCos;
      if (0 < pVVar9->nSize) {
        lVar13 = 0;
        do {
          iVar8 = pVVar9->pArray[lVar13];
          if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_0052355e;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar8;
          uVar15 = *(ulong *)pGVar4;
          uVar14 = (uint)uVar15;
          if ((-1 < (int)uVar14) || ((uVar14 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x349,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          uVar6 = *(ulong *)(pGVar4 + -(ulong)(uVar14 & 0x1fffffff)) & 0x4000000040000000;
          if (uVar6 == 0) {
            __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x34a,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
          }
          if ((((uVar14 >> 0x1d & 1) == 0) || (uVar6 != 0x4000000000000000)) &&
             (((uVar14 >> 0x1d & 1) != 0 || (uVar6 != 0x40000000)))) {
            if ((((byte)(uVar15 >> 0x1d) & 1 & uVar6 == 0x40000000) == 0) &&
               ((uVar15 >> 0x1d & 1) != 0 || uVar6 != 0x4000000000000000)) {
              uVar15 = uVar15 | 0x4000000040000000;
            }
            else {
              uVar15 = uVar15 & 0xbfffffffbfffffff | 0x4000000000000000;
            }
          }
          else {
            uVar15 = uVar15 & 0xbfffffffbfffffff | 0x40000000;
          }
          *(ulong *)pGVar4 = uVar15;
          lVar13 = lVar13 + 1;
          pVVar9 = p->vCos;
        } while (lVar13 < pVVar9->nSize);
      }
      bVar5 = iVar12 < pCex->iFrame;
      iVar12 = iVar12 + 1;
    } while (bVar5);
  }
  uVar14 = pCex->iPo;
  iVar12 = p->vCos->nSize;
  if (iVar12 - p->nRegs <= (int)uVar14) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar14) && ((int)uVar14 < iVar12)) {
    iVar12 = p->vCos->pArray[uVar14];
    if ((-1 < (long)iVar12) && (iVar12 < p->nObjs)) {
      return (uint)(((uint)*(undefined8 *)(p->pObjs + iVar12) >> 0x1e & 1) == 0) &
             (uint)((ulong)*(undefined8 *)(p->pObjs + iVar12) >> 0x3e);
    }
LAB_0052355e:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_0052357d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Bmc_CexVerify( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare )
{
    Gia_Obj_t * pObj;
    int i, k;
//    assert( pCex->nRegs > 0 );
//    assert( pCexCare->nRegs == 0 );
    Gia_ObjTerSimSet0( Gia_ManConst0(p) );
    Gia_ManForEachRi( p, pObj, k )
        Gia_ObjTerSimSet0( pObj );
    for ( i = 0; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
        {
            if ( !Abc_InfoHasBit( pCexCare->pData, pCexCare->nRegs + i * pCexCare->nPis + k ) )
                Gia_ObjTerSimSetX( pObj );
            else if ( Abc_InfoHasBit( pCex->pData, pCex->nRegs + i * pCex->nPis + k ) )
                Gia_ObjTerSimSet1( pObj );
            else
                Gia_ObjTerSimSet0( pObj );
        }
        Gia_ManForEachRo( p, pObj, k )
            Gia_ObjTerSimRo( p, pObj );
        Gia_ManForEachAnd( p, pObj, k )
            Gia_ObjTerSimAnd( pObj );
        Gia_ManForEachCo( p, pObj, k )
            Gia_ObjTerSimCo( pObj );
    }
    pObj = Gia_ManPo( p, pCex->iPo );
    return Gia_ObjTerSimGet1(pObj);
}